

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::Serialization<std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>_>::
     load(BinaryBuffer *bb,Vector *v)

{
  Bounds<float> *in_RSI;
  size_t s;
  unsigned_long *in_stack_ffffffffffffff38;
  BinaryBuffer *in_stack_ffffffffffffff40;
  Bounds<float> *this;
  Bounds<float> *x;
  BinaryBuffer *bb_00;
  value_type *in_stack_ffffffffffffff60;
  BinaryBuffer in_stack_ffffffffffffff68;
  vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *in_stack_ffffffffffffff70;
  Bounds<float> *local_18;
  
  load<unsigned_long>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  bb_00 = (BinaryBuffer *)&stack0xffffffffffffff68;
  this = in_RSI;
  x = local_18;
  Bounds<float>::Bounds((Bounds<float> *)0x173415);
  std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::resize
            (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68._vptr_BinaryBuffer,
             in_stack_ffffffffffffff60);
  Bounds<float>::~Bounds(this);
  if (local_18 != (Bounds<float> *)0x0) {
    std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::operator[]
              ((vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *)in_RSI,0);
    load<diy::Bounds<float>>(bb_00,x,(size_t)this);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }